

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_variable_type(adios2_type *type,adios2_variable *variable)

{
  DataType DVar1;
  DataType DVar2;
  long in_RSI;
  undefined4 *in_RDI;
  DataType typeCpp;
  VariableBase *variableBase;
  allocator local_39;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  adios2_variable *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for const adios2_variable, in call to adios2_variable_type",&local_39);
  adios2::helper::CheckForNullptr<adios2_variable_const>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  DVar1 = *(DataType *)(in_RSI + 0x28);
  DVar2 = adios2::helper::GetDataType<std::__cxx11::string>();
  if (DVar1 == DVar2) {
    *in_RDI = 0;
  }
  else {
    DVar2 = adios2::helper::GetDataType<signed_char>();
    if (DVar1 == DVar2) {
      *in_RDI = 5;
    }
    else {
      DVar2 = adios2::helper::GetDataType<short>();
      if (DVar1 == DVar2) {
        *in_RDI = 6;
      }
      else {
        DVar2 = adios2::helper::GetDataType<int>();
        if (DVar1 == DVar2) {
          *in_RDI = 7;
        }
        else {
          DVar2 = adios2::helper::GetDataType<long>();
          if (DVar1 == DVar2) {
            *in_RDI = 8;
          }
          else {
            DVar2 = adios2::helper::GetDataType<unsigned_char>();
            if (DVar1 == DVar2) {
              *in_RDI = 9;
            }
            else {
              DVar2 = adios2::helper::GetDataType<unsigned_short>();
              if (DVar1 == DVar2) {
                *in_RDI = 10;
              }
              else {
                DVar2 = adios2::helper::GetDataType<unsigned_int>();
                if (DVar1 == DVar2) {
                  *in_RDI = 0xb;
                }
                else {
                  DVar2 = adios2::helper::GetDataType<unsigned_long>();
                  if (DVar1 == DVar2) {
                    *in_RDI = 0xc;
                  }
                  else {
                    DVar2 = adios2::helper::GetDataType<float>();
                    if (DVar1 == DVar2) {
                      *in_RDI = 1;
                    }
                    else {
                      DVar2 = adios2::helper::GetDataType<double>();
                      if (DVar1 == DVar2) {
                        *in_RDI = 2;
                      }
                      else {
                        DVar2 = adios2::helper::GetDataType<long_double>();
                        if (DVar1 == DVar2) {
                          *in_RDI = 0xd;
                        }
                        else {
                          DVar2 = adios2::helper::GetDataType<std::complex<float>>();
                          if (DVar1 == DVar2) {
                            *in_RDI = 3;
                          }
                          else {
                            DVar2 = adios2::helper::GetDataType<std::complex<double>>();
                            if (DVar1 == DVar2) {
                              *in_RDI = 4;
                            }
                            else {
                              *in_RDI = 0xffffffff;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_type(adios2_type *type, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(
            variable, "for const adios2_variable, in call to adios2_variable_type");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::helper::GetDataType<std::string>())
        {
            *type = adios2_type_string;
        }
#define make_case(T)                                                                               \
    else if (typeCpp == adios2::helper::GetDataType<MapAdios2Type<T>::Type>())                     \
    {                                                                                              \
        *type = T;                                                                                 \
    }
        ADIOS2_FOREACH_C_TYPE_1ARG(make_case)
#undef make_case
        else
        {
            *type = adios2_type_unknown;
        }
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_type"));
    }
}